

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

string * __thiscall
Catch::clara::TextFlow::Column::iterator::operator*[abi_cxx11_
          (string *__return_storage_ptr__,iterator *this)

{
  string sStack_38;
  
  ::std::__cxx11::string::substr
            ((ulong)&sStack_38,
             (ulong)((this->m_column->m_strings).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + this->m_stringIndex));
  addIndentAndSuffix(__return_storage_ptr__,this,&sStack_38);
  ::std::__cxx11::string::~string((string *)&sStack_38);
  return __return_storage_ptr__;
}

Assistant:

auto operator *() const -> std::string {
			assert(m_stringIndex < m_column.m_strings.size());
			assert(m_pos <= m_end);
			return addIndentAndSuffix(line().substr(m_pos, m_len));
		}